

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_state.cc
# Opt level: O2

unique_ptr<TestState,_std::default_delete<TestState>_> __thiscall
TestState::Deserialize(TestState *this,CBS *cbs,SSL_CTX *ctx)

{
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> __p;
  int iVar1;
  __single_object state;
  uint16_t version;
  uint64_t usec;
  CBS in;
  uint64_t sec;
  CBS text;
  CBS pending_session;
  _Head_base<0UL,_TestState_*,_false> local_88;
  uint16_t local_7a;
  ulong local_78;
  CBS local_70;
  uint64_t local_60;
  CBS local_58;
  CBS local_48;
  __uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> local_38 [2];
  undefined1 local_28 [16];
  
  std::make_unique<TestState>();
  iVar1 = CBS_get_u24_length_prefixed(cbs,&local_70);
  if (iVar1 != 0) {
    iVar1 = CBS_get_u16(&local_70,&local_7a);
    if ((iVar1 != 0) && (local_7a == 0)) {
      iVar1 = CBS_get_u24_length_prefixed(&local_70,&local_48);
      if (iVar1 != 0) {
        iVar1 = CBS_get_u16_length_prefixed(&local_70,&local_58);
        if (iVar1 != 0) {
          iVar1 = CBS_get_asn1_uint64(&local_70,&local_60);
          if (iVar1 != 0) {
            iVar1 = CBS_get_asn1_uint64(&local_70,&local_78);
            if ((iVar1 != 0) && (local_78 < 1000000)) {
              if (local_48.len != 0) {
                bssl::SSL_SESSION_parse((bssl *)local_38,&local_48,ctx->x509_method,ctx->pool);
                __p._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                     local_38[0]._M_t.
                     super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                     super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl;
                local_38[0]._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                     (tuple<ssl_session_st_*,_bssl::internal::Deleter>)
                     (_Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>)0x0;
                std::__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>::reset
                          ((__uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter> *)
                           &(local_88._M_head_impl)->pending_session,
                           (pointer)__p._M_t.
                                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>
                                    .super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl);
                std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                          ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)local_38);
                if (((local_88._M_head_impl)->pending_session)._M_t.
                    super___uniq_ptr_impl<ssl_session_st,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl ==
                    (ssl_session_st *)0x0) goto LAB_0012dc70;
              }
              local_38[0]._M_t.super__Tuple_impl<0UL,_ssl_session_st_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_ssl_session_st_*,_false>._M_head_impl =
                   (tuple<ssl_session_st_*,_bssl::internal::Deleter>)local_28;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_38,local_58.data,local_58.data + local_58.len);
              std::__cxx11::string::operator=
                        ((string *)&(local_88._M_head_impl)->msg_callback_text,(string *)local_38);
              std::__cxx11::string::~string((string *)local_38);
              g_clock.tv_sec = local_60;
              g_clock.tv_usec = local_78;
              this->async_bio = (BIO *)local_88._M_head_impl;
              local_88._M_head_impl = (TestState *)0x0;
              goto LAB_0012dc74;
            }
          }
        }
      }
    }
  }
LAB_0012dc70:
  this->async_bio = (BIO *)0x0;
LAB_0012dc74:
  std::unique_ptr<TestState,_std::default_delete<TestState>_>::~unique_ptr
            ((unique_ptr<TestState,_std::default_delete<TestState>_> *)&local_88);
  return (__uniq_ptr_data<TestState,_std::default_delete<TestState>,_true,_true>)
         (__uniq_ptr_data<TestState,_std::default_delete<TestState>,_true,_true>)this;
}

Assistant:

std::unique_ptr<TestState> TestState::Deserialize(CBS *cbs, SSL_CTX *ctx) {
  CBS in, pending_session, text;
  auto state = std::make_unique<TestState>();
  uint16_t version;
  constexpr uint16_t kVersion = 0;
  uint64_t sec, usec;
  if (!CBS_get_u24_length_prefixed(cbs, &in) ||  //
      !CBS_get_u16(&in, &version) ||             //
      version > kVersion ||
      !CBS_get_u24_length_prefixed(&in, &pending_session) ||
      !CBS_get_u16_length_prefixed(&in, &text) ||
      !CBS_get_asn1_uint64(&in, &sec) ||   //
      !CBS_get_asn1_uint64(&in, &usec) ||  //
      usec >= 1000000) {
    return nullptr;
  }
  if (CBS_len(&pending_session)) {
    state->pending_session = SSL_SESSION_parse(
        &pending_session, ctx->x509_method, ctx->pool);
    if (!state->pending_session) {
      return nullptr;
    }
  }
  state->msg_callback_text = std::string(
      reinterpret_cast<const char *>(CBS_data(&text)), CBS_len(&text));
  g_clock.tv_sec = sec;
  g_clock.tv_usec = usec;
  return state;
}